

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall OpenMD::HBondJump::findHBonds(HBondJump *this,int frame)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int in_ESI;
  Vector3<double> *in_RDI;
  int aInd;
  int index;
  int hInd;
  Vector3d aPos;
  Vector3d hPos;
  Vector3d dPos;
  Atom *hba;
  iterator hbai;
  HBondDonor *hbd;
  iterator hbdi;
  MoleculeIterator mj;
  MoleculeIterator mi;
  Molecule *mol2;
  Molecule *mol1;
  Vector3<double> *in_stack_fffffffffffffe28;
  StuntDouble *in_stack_fffffffffffffe38;
  iterator *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  HBondJump *in_stack_fffffffffffffe60;
  Vector3d *in_stack_ffffffffffffff00;
  Vector3d *in_stack_ffffffffffffff08;
  Vector3d *in_stack_ffffffffffffff10;
  HBondJump *in_stack_ffffffffffffff18;
  Atom *local_50;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_48;
  HBondDonor *local_40;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_38;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28;
  Molecule *local_20;
  Molecule *local_18;
  int local_c;
  
  local_c = in_ESI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_28);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_48);
  Vector3<double>::Vector3((Vector3<double> *)0x1590c4);
  Vector3<double>::Vector3((Vector3<double> *)0x1590d1);
  Vector3<double>::Vector3((Vector3<double> *)0x1590de);
  local_18 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        (MoleculeIterator *)in_stack_fffffffffffffe48);
  while (local_18 != (Molecule *)0x0) {
    local_40 = Molecule::beginHBondDonor
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (iterator *)in_stack_fffffffffffffe48);
    while (local_40 != (HBondDonor *)0x0) {
      iVar2 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
      (**(code **)((long)(in_RDI->super_Vector<double,_3U>).data_[0] + 0xa0))(in_RDI,local_c,iVar2);
      local_40 = Molecule::nextHBondDonor
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            (iterator *)in_stack_fffffffffffffe48);
    }
    local_18 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (MoleculeIterator *)in_stack_fffffffffffffe48);
  }
  local_18 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        (MoleculeIterator *)in_stack_fffffffffffffe48);
  while (local_18 != (Molecule *)0x0) {
    local_40 = Molecule::beginHBondDonor
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (iterator *)in_stack_fffffffffffffe48);
    while (local_40 != (HBondDonor *)0x0) {
      iVar2 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x98),(long)local_c);
      std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar2);
      StuntDouble::getPos(in_stack_fffffffffffffe38);
      Vector3<double>::operator=(in_RDI,in_stack_fffffffffffffe28);
      StuntDouble::getPos(in_stack_fffffffffffffe38);
      Vector3<double>::operator=(in_RDI,in_stack_fffffffffffffe28);
      local_30._M_node = local_28._M_node;
      local_20 = SimInfo::beginMolecule
                           ((SimInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                            ,(MoleculeIterator *)in_stack_fffffffffffffe48);
      while (local_20 != (Molecule *)0x0) {
        local_50 = Molecule::beginHBondAcceptor
                             ((Molecule *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                              in_stack_fffffffffffffe48);
        while (local_50 != (Atom *)0x0) {
          StuntDouble::getPos(in_stack_fffffffffffffe38);
          Vector3<double>::operator=(in_RDI,in_stack_fffffffffffffe28);
          Vector3<double>::Vector3(in_RDI,in_stack_fffffffffffffe28);
          Vector3<double>::Vector3(in_RDI,in_stack_fffffffffffffe28);
          Vector3<double>::Vector3(in_RDI,in_stack_fffffffffffffe28);
          bVar1 = isHBond(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          if (bVar1) {
            StuntDouble::getGlobalIndex(&local_50->super_StuntDouble);
            registerHydrogenBond
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58
                       ,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
          }
          local_50 = Molecule::nextHBondAcceptor
                               ((Molecule *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                in_stack_fffffffffffffe48);
        }
        local_20 = SimInfo::nextMolecule
                             ((SimInfo *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                              (MoleculeIterator *)in_stack_fffffffffffffe48);
      }
      local_40 = Molecule::nextHBondDonor
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            (iterator *)in_stack_fffffffffffffe48);
    }
    local_50 = Molecule::beginHBondAcceptor
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48);
    while (local_50 != (Atom *)0x0) {
      StuntDouble::getPos(in_stack_fffffffffffffe38);
      Vector3<double>::operator=(in_RDI,in_stack_fffffffffffffe28);
      local_30._M_node = local_28._M_node;
      local_20 = SimInfo::beginMolecule
                           ((SimInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                            ,(MoleculeIterator *)in_stack_fffffffffffffe48);
      while (local_20 != (Molecule *)0x0) {
        local_40 = Molecule::beginHBondDonor
                             ((Molecule *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                              (iterator *)in_stack_fffffffffffffe48);
        while (local_40 != (HBondDonor *)0x0) {
          iVar2 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
          pvVar3 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x98),(long)local_c);
          std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar2);
          StuntDouble::getPos(in_stack_fffffffffffffe38);
          Vector3<double>::operator=(in_RDI,in_stack_fffffffffffffe28);
          StuntDouble::getPos(in_stack_fffffffffffffe38);
          Vector3<double>::operator=(in_RDI,in_stack_fffffffffffffe28);
          Vector3<double>::Vector3(in_RDI,in_stack_fffffffffffffe28);
          Vector3<double>::Vector3(in_RDI,in_stack_fffffffffffffe28);
          Vector3<double>::Vector3(in_RDI,in_stack_fffffffffffffe28);
          bVar1 = isHBond(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          if (bVar1) {
            StuntDouble::getGlobalIndex(&local_50->super_StuntDouble);
            registerHydrogenBond
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58
                       ,in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
          }
          local_40 = Molecule::nextHBondDonor
                               ((Molecule *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                (iterator *)in_stack_fffffffffffffe48);
        }
        local_20 = SimInfo::nextMolecule
                             ((SimInfo *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                              (MoleculeIterator *)in_stack_fffffffffffffe48);
      }
      local_50 = Molecule::nextHBondAcceptor
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48);
    }
    local_18 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (MoleculeIterator *)in_stack_fffffffffffffe48);
  }
  return;
}

Assistant:

void HBondJump::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos;
    int hInd, index, aInd;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }
    }
  }